

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

iterator __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::find<unsigned_long>
          (raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
           *this,key_arg<unsigned_long> *key,size_t hash)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  uint uVar5;
  size_t sVar6;
  unsigned_long *key_1;
  __m128i match;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  iterator iVar14;
  probe_seq<16UL> seq;
  anon_union_8_1_a8a14541_for_iterator_1 local_38;
  ulong local_30;
  long local_28;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  
  probe((probe_seq<16UL> *)&local_38,this,hash);
  auVar7 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar7 = pshuflw(auVar7,auVar7,0);
  do {
    pcVar1 = this->ctrl_ + local_30;
    cVar3 = pcVar1[0xf];
    cVar9 = auVar7[0];
    auVar10[0] = -(cVar9 == *pcVar1);
    cVar11 = auVar7[1];
    auVar10[1] = -(cVar11 == pcVar1[1]);
    cVar12 = auVar7[2];
    auVar10[2] = -(cVar12 == pcVar1[2]);
    cVar13 = auVar7[3];
    auVar10[3] = -(cVar13 == pcVar1[3]);
    auVar10[4] = -(cVar9 == pcVar1[4]);
    auVar10[5] = -(cVar11 == pcVar1[5]);
    auVar10[6] = -(cVar12 == pcVar1[6]);
    auVar10[7] = -(cVar13 == pcVar1[7]);
    auVar10[8] = -(cVar9 == pcVar1[8]);
    auVar10[9] = -(cVar11 == pcVar1[9]);
    auVar10[10] = -(cVar12 == pcVar1[10]);
    auVar10[0xb] = -(cVar13 == pcVar1[0xb]);
    auVar10[0xc] = -(cVar9 == pcVar1[0xc]);
    auVar10[0xd] = -(cVar11 == pcVar1[0xd]);
    auVar10[0xe] = -(cVar12 == pcVar1[0xe]);
    auVar10[0xf] = -(cVar13 == cVar3);
    for (uVar5 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar10[0xf] >> 7) << 0xf); uVar5 != 0;
        uVar5 = uVar5 - 1 & uVar5) {
      uVar2 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      sVar6 = uVar2 + local_30 & (ulong)local_38.slot_;
      if (this->slots_[sVar6]->first == *key) {
        local_38.slot_ = this->slots_ + sVar6;
        goto LAB_0010d168;
      }
    }
    auVar8[0] = -(*pcVar1 == -0x80);
    auVar8[1] = -(pcVar1[1] == -0x80);
    auVar8[2] = -(pcVar1[2] == -0x80);
    auVar8[3] = -(pcVar1[3] == -0x80);
    auVar8[4] = -(pcVar1[4] == -0x80);
    auVar8[5] = -(pcVar1[5] == -0x80);
    auVar8[6] = -(pcVar1[6] == -0x80);
    auVar8[7] = -(pcVar1[7] == -0x80);
    auVar8[8] = -(pcVar1[8] == -0x80);
    auVar8[9] = -(pcVar1[9] == -0x80);
    auVar8[10] = -(pcVar1[10] == -0x80);
    auVar8[0xb] = -(pcVar1[0xb] == -0x80);
    auVar8[0xc] = -(pcVar1[0xc] == -0x80);
    auVar8[0xd] = -(pcVar1[0xd] == -0x80);
    auVar8[0xe] = -(pcVar1[0xe] == -0x80);
    auVar8[0xf] = -(cVar3 == -0x80);
    if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar8 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar8 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar8 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar8 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar8 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar8 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar3 == -0x80) {
      sVar6 = this->capacity_;
LAB_0010d168:
      iVar14.ctrl_ = this->ctrl_ + sVar6;
      iVar14.field_1.slot_ = local_38.slot_;
      return iVar14;
    }
    lVar4 = local_30 + local_28;
    local_28 = local_28 + 0x10;
    local_30 = lVar4 + 0x10U & (ulong)local_38.slot_;
  } while( true );
}

Assistant:

iterator find(const key_arg<K>& key, size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (int i : g.Match(H2(hash))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset(i)))))
                    return iterator_at(seq.offset(i));
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) 
                return end();
            seq.next();
        }
    }